

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::Production::SetProduction
          (Production *this,String *name,uint left,uint *pright,uint rightCount,size_t line,
          uint prec)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  size_t line_local;
  uint rightCount_local;
  uint *pright_local;
  uint left_local;
  String *name_local;
  Production *this_local;
  
  if (((this->pRight != (uint *)0x0) &&
      (uVar2 = *this->pRight - 1, *this->pRight = uVar2, uVar2 == 0)) &&
     (this->pRight != (uint *)0x0)) {
    operator_delete__(this->pRight);
  }
  std::__cxx11::string::operator=((string *)this,(string *)name);
  this->Precedence = prec;
  this->Left = left;
  this->Length = rightCount;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)this->Length + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar4 = (uint *)operator_new__(uVar3);
  this->pRight = puVar4;
  this->Line = line;
  this->NotReported = false;
  *this->pRight = 1;
  std::copy<unsigned_int_const*,unsigned_int*>(pright,pright + this->Length,this->pRight + 1);
  return;
}

Assistant:

void Production::SetProduction(const String& name, unsigned left, const unsigned* pright,
                               unsigned rightCount, size_t line, unsigned prec) {
    // Delete RHS
    if (pRight)
        if (!(--pRight[0u]))
            delete[] pRight;

    Name        = name;
    Precedence  = prec;
    Left        = left;
    Length      = rightCount;
    pRight      = new unsigned[size_t(Length) + 1u];
    Line        = line;
    NotReported = 0u;

    pRight[0u]  = 1u;
    std::copy(pright, pright + Length, pRight + 1u);
}